

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O3

json __thiscall inja::Environment::load_json(Environment *this,string *filename)

{
  FileError *this_00;
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  json_value extraout_RDX;
  json jVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> first;
  path pStack_308;
  path local_2e0;
  string local_2b8;
  undefined8 local_298;
  undefined8 uStack_290;
  code *local_288;
  undefined8 uStack_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ifstream file;
  byte abStack_210 [200];
  undefined8 auStack_148 [36];
  
  ::std::ifstream::ifstream(&file);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_308,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_2e0,(path *)(filename + 0x14),&pStack_308);
  ::std::ifstream::open((char *)&file,(_Ios_Openmode)local_2e0._M_pathname._M_dataplus._M_p);
  std::filesystem::__cxx11::path::~path(&local_2e0);
  std::filesystem::__cxx11::path::~path(&pStack_308);
  if ((abStack_210[*(long *)(_file + -0x18)] & 5) == 0) {
    local_298 = 0;
    uStack_290 = 0;
    local_288 = (code *)0x0;
    uStack_280 = 0;
    first._8_8_ = *(undefined8 *)((long)auStack_148 + *(long *)(_file + -0x18));
    first._M_sbuf = (streambuf_type *)this;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::istreambuf_iterator<char,std::char_traits<char>>>
              (first,(istreambuf_iterator<char,_std::char_traits<char>_>)ZEXT816(0xffffffff),
               (parser_callback_t *)0xffffffff,SUB81(&local_298,0),true);
    if (local_288 != (code *)0x0) {
      (*local_288)(&local_298,&local_298,3);
    }
    ::std::ifstream::~ifstream(&file);
    jVar3.m_data.m_value.object = extraout_RDX.object;
    jVar3.m_data._0_8_ = this;
    return (json)jVar3.m_data;
  }
  this_00 = (FileError *)__cxa_allocate_exception(0x60);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_308,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_2e0,(path *)(filename + 0x14),&pStack_308);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,local_2e0._M_pathname._M_dataplus._M_p,
             local_2e0._M_pathname._M_dataplus._M_p + local_2e0._M_pathname._M_string_length);
  ::std::operator+(&local_250,"failed accessing file at \'",&local_270);
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_250);
  local_2b8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_2b8._M_dataplus._M_p == psVar2) {
    local_2b8.field_2._M_allocated_capacity = *psVar2;
    local_2b8.field_2._8_8_ = plVar1[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar2;
  }
  local_2b8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FileError::FileError(this_00,&local_2b8);
  __cxa_throw(this_00,&FileError::typeinfo,InjaError::~InjaError);
}

Assistant:

json load_json(const std::string& filename) {
    std::ifstream file;
    file.open(input_path / filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + (input_path / filename).string() + "'"));
    }

    return json::parse(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>());
  }